

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseBlockInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  undefined8 uVar2;
  size_t sVar3;
  bool bVar4;
  TokenType TVar5;
  Result RVar6;
  pointer *__ptr;
  pointer pCVar7;
  undefined1 local_d8 [16];
  CatchVector catches;
  Var var;
  Location loc;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  GetLocation(&loc,this);
  TVar5 = Peek(this,0);
  if (TVar5 != Try) {
    if (TVar5 != If) {
      if (TVar5 == Loop) {
        Consume((Token *)&var,this);
        std::make_unique<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Location&>(&var.loc);
      }
      else {
        if (TVar5 != Block) {
          __assert_fail("!\"ParseBlockInstr should only be called when IsBlockInstr() is true\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                        ,0xb56,"Result wabt::WastParser::ParseBlockInstr(std::unique_ptr<Expr> *)");
        }
        Consume((Token *)&var,this);
        std::make_unique<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Location&>(&var.loc);
      }
      RVar6 = ParseLabelOpt(this,(string *)(var.loc.filename._M_len + 0x40));
      pCVar7 = (pointer)var.loc.filename._M_len;
      if ((((RVar6.enum_ == Error) ||
           (RVar6 = ParseBlock(this,(Block *)(var.loc.filename._M_len + 0x40)),
           pCVar7 = (pointer)var.loc.filename._M_len, RVar6.enum_ == Error)) ||
          (RVar6 = Expect(this,End), pCVar7 = (pointer)var.loc.filename._M_len, RVar6.enum_ == Error
          )) || (RVar6 = ParseEndLabelOpt(this,(string *)(var.loc.filename._M_len + 0x40)),
                sVar3 = var.loc.filename._M_len, pCVar7 = (pointer)var.loc.filename._M_len,
                RVar6.enum_ == Error)) goto LAB_0013311f;
      var.loc.filename._M_len = 0;
      pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)sVar3;
      if (pEVar1 == (Expr *)0x0) {
        return (Result)Ok;
      }
      (*pEVar1->_vptr_Expr[1])();
      pCVar7 = (pointer)var.loc.filename._M_len;
      goto LAB_00133165;
    }
    Consume((Token *)&var,this);
    std::make_unique<wabt::IfExpr,wabt::Location&>((Location *)&catches);
    RVar6 = ParseLabelOpt(this,(string *)
                               &((catches.
                                  super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->var).type_);
    pCVar7 = catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((RVar6.enum_ != Error) &&
       (RVar6 = ParseBlock(this,(Block *)&((catches.
                                            super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->var).type_),
       pCVar7 = catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                super__Vector_impl_data._M_start, RVar6.enum_ != Error)) {
      bVar4 = Match(this,Else);
      if (bVar4) {
        RVar6 = ParseEndLabelOpt(this,(string *)
                                      &((catches.
                                         super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->var).type_);
        pCVar7 = catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((RVar6.enum_ == Error) ||
           (RVar6 = ParseTerminatingInstrList
                              (this,(ExprList *)
                                    &catches.
                                     super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                                     _M_impl.super__Vector_impl_data._M_start[3].loc.filename._M_str
                              ),
           pCVar7 = catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                    super__Vector_impl_data._M_start, RVar6.enum_ == Error)) goto LAB_0013311f;
        GetLocation(&var.loc,this);
        catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_start[3].var.loc.field_1.field_1.offset =
             (size_t)var.loc.field_1.field_1.offset;
        *(undefined8 *)
         ((long)&catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                 super__Vector_impl_data._M_start[3].var.loc.field_1 + 8) = var.loc.field_1._8_8_;
        catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_start[3].var.loc.filename._M_len = var.loc.filename._M_len;
        catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_start[3].var.loc.filename._M_str = var.loc.filename._M_str;
      }
      RVar6 = Expect(this,End);
      pCVar7 = catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((RVar6.enum_ != Error) &&
         (RVar6 = ParseEndLabelOpt(this,(string *)
                                        &((catches.
                                           super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->var).type_),
         pCVar7 = catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                  super__Vector_impl_data._M_start, RVar6.enum_ != Error)) {
        catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pEVar1 = (out_expr->_M_t).
                 super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                 super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                 super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
        (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
        super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
        super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)pCVar7;
        if (pEVar1 == (Expr *)0x0) {
          return (Result)Ok;
        }
        (*pEVar1->_vptr_Expr[1])();
        pCVar7 = catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                 super__Vector_impl_data._M_start;
        goto LAB_00133165;
      }
    }
    goto LAB_0013311f;
  }
  Consume((Token *)&var,this);
  ErrorUnlessOpcodeEnabled(this,(Token *)&var);
  std::make_unique<wabt::TryExpr,wabt::Location&>((Location *)local_d8);
  catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  catches.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  RVar6 = ParseLabelOpt(this,(string *)&((Var *)(local_d8._0_8_ + 0x20))->type_);
  if ((RVar6.enum_ != Error) &&
     (RVar6 = ParseBlock(this,(Block *)&((Var *)(local_d8._0_8_ + 0x20))->type_),
     RVar6.enum_ != Error)) {
    TVar5 = Peek(this,0);
    if (TVar5 - Catch < 2) {
      RVar6 = ParseCatchInstrList(this,(CatchVector *)
                                       &(((pointer)(local_d8._0_8_ + 0x180))->loc).filename._M_str);
      if (RVar6.enum_ == Error) goto LAB_00133111;
      *(undefined4 *)((long)&(((Var *)(local_d8._0_8_ + 0x20))->loc).field_1 + 0xc) = 1;
    }
    else {
      TVar5 = Peek(this,0);
      if (TVar5 == Delegate) {
        Consume((Token *)&var,this);
        Var::Var(&var);
        RVar6 = ParseVar(this,&var);
        if (RVar6.enum_ == Error) {
          Var::~Var(&var);
          goto LAB_00133111;
        }
        Var::operator=(&((pointer)(local_d8._0_8_ + 0x180))->var,&var);
        *(undefined4 *)((long)&(((Var *)(local_d8._0_8_ + 0x20))->loc).field_1 + 0xc) = 2;
        Var::~Var(&var);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&var,"a valid try clause",(allocator<char> *)(local_d8 + 0xf));
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,&var,
               &var.type_);
    RVar6 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_48,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    std::__cxx11::string::_M_dispose();
    if (RVar6.enum_ != Error) {
      GetLocation(&var.loc,this);
      (((pointer)(local_d8._0_8_ + 0x100))->exprs).size_ = (size_t)var.loc.field_1.field_1.offset;
      (((pointer)(local_d8._0_8_ + 0x180))->loc).filename._M_len = var.loc.field_1._8_8_;
      (((pointer)(local_d8._0_8_ + 0x100))->exprs).first_ = (Expr *)var.loc.filename._M_len;
      (((pointer)(local_d8._0_8_ + 0x100))->exprs).last_ = (Expr *)var.loc.filename._M_str;
      if (((*(int *)((long)&(((Var *)(local_d8._0_8_ + 0x20))->loc).field_1 + 0xc) == 2) ||
          (RVar6 = Expect(this,End), RVar6.enum_ != Error)) &&
         (RVar6 = ParseEndLabelOpt(this,(string *)&((Var *)(local_d8._0_8_ + 0x20))->type_),
         uVar2 = local_d8._0_8_, RVar6.enum_ != Error)) {
        local_d8._0_8_ = (pointer)0x0;
        pEVar1 = (out_expr->_M_t).
                 super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                 super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                 super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
        (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
        super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
        super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)uVar2;
        if (pEVar1 != (Expr *)0x0) {
          (*pEVar1->_vptr_Expr[1])();
        }
        std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::~vector(&catches);
        pCVar7 = (pointer)local_d8._0_8_;
LAB_00133165:
        if (pCVar7 != (pointer)0x0) {
          (*((_func_int **)(pCVar7->loc).filename._M_len)[1])();
        }
        return (Result)Ok;
      }
    }
  }
LAB_00133111:
  std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::~vector(&catches);
  pCVar7 = (pointer)local_d8._0_8_;
LAB_0013311f:
  if (pCVar7 != (pointer)0x0) {
    (*((_func_int **)(pCVar7->loc).filename._M_len)[1])();
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseBlockInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParseBlockInstr);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Block: {
      Consume();
      auto expr = std::make_unique<BlockExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Loop: {
      Consume();
      auto expr = std::make_unique<LoopExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::If: {
      Consume();
      auto expr = std::make_unique<IfExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
      CHECK_RESULT(ParseBlock(&expr->true_));
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Try: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = std::make_unique<TryExpr>(loc);
      CatchVector catches;
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      if (IsCatch(Peek())) {
        CHECK_RESULT(ParseCatchInstrList(&expr->catches));
        expr->kind = TryKind::Catch;
      } else if (PeekMatch(TokenType::Delegate)) {
        Consume();
        Var var;
        CHECK_RESULT(ParseVar(&var));
        expr->delegate_target = var;
        expr->kind = TryKind::Delegate;
      }
      CHECK_RESULT(ErrorIfLpar({"a valid try clause"}));
      expr->block.end_loc = GetLocation();
      if (expr->kind != TryKind::Delegate) {
        EXPECT(End);
      }
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    default:
      assert(
          !"ParseBlockInstr should only be called when IsBlockInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}